

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede3_wrap(PROV_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  size_t siz;
  uchar *puVar2;
  size_t in_RCX;
  void *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  size_t len;
  size_t icvlen;
  size_t ivlen;
  uchar sha1tmp [20];
  size_t __n;
  size_t in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  OSSL_LIB_CTX *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  __n = 8;
  siz = in_RCX + 0x10;
  iVar3 = (int)siz;
  if (in_RSI != (uchar *)0x0) {
    memmove(in_RSI + 8,in_RDX,in_RCX);
    puVar2 = ossl_sha1((uchar *)len,unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (puVar2 == (uchar *)0x0) {
      iVar3 = 0;
    }
    else {
      memcpy(in_RSI + __n + in_RCX,&stack0xffffffffffffffb8,8);
      OPENSSL_cleanse(&stack0xffffffffffffffb8,0x14);
      iVar1 = RAND_bytes_ex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8,(uint)(__n >> 0x20));
      if (iVar1 < 1) {
        iVar3 = 0;
      }
      else {
        memcpy(in_RSI,(void *)(in_RDI + 0x94),__n);
        (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RSI + __n,in_RSI + __n,in_RCX + __n);
        BUF_reverse(in_RSI,(uchar *)0x0,siz);
        memcpy((void *)(in_RDI + 0x94),wrap_iv,__n);
        (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RSI,in_RSI,siz);
      }
    }
  }
  return iVar3;
}

Assistant:

static int des_ede3_wrap(EVP_CIPHER_CTX *ctx, unsigned char *out,
                         const unsigned char *in, size_t inl)
{
    unsigned char sha1tmp[SHA_DIGEST_LENGTH];
    if (out == NULL)
        return inl + 16;
    /* Copy input to output buffer + 8 so we have space for IV */
    memmove(out + 8, in, inl);
    /* Work out ICV */
    if (!ossl_sha1(in, inl, sha1tmp))
        return -1;
    memcpy(out + inl + 8, sha1tmp, 8);
    OPENSSL_cleanse(sha1tmp, SHA_DIGEST_LENGTH);
    /* Generate random IV */
    if (RAND_bytes(ctx->iv, 8) <= 0)
        return -1;
    memcpy(out, ctx->iv, 8);
    /* Encrypt everything after IV in place */
    des_ede_cbc_cipher(ctx, out + 8, out + 8, inl + 8);
    BUF_reverse(out, NULL, inl + 16);
    memcpy(ctx->iv, wrap_iv, 8);
    des_ede_cbc_cipher(ctx, out, out, inl + 16);
    return inl + 16;
}